

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_global_init(long flags)

{
  atomic_int aVar1;
  CURLcode CVar2;
  _Bool in_SIL;
  
  aVar1 = s_lock;
  LOCK();
  s_lock = 1;
  UNLOCK();
  if (aVar1 != 0) {
    do {
    } while( true );
  }
  CVar2 = global_init(1,in_SIL);
  s_lock = 0;
  return CVar2;
}

Assistant:

CURLcode curl_global_init(long flags)
{
  CURLcode result;
  global_init_lock();

  result = global_init(flags, TRUE);

  global_init_unlock();

  return result;
}